

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O0

void __thiscall
vkt::texture::SampleVerifier::getFilteredSample1D
          (SampleVerifier *this,IVec3 *texelBase,float weight,int layer,int level,Vec4 *resultMin,
          Vec4 *resultMax)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  double dVar4;
  float local_224;
  Interval *local_208;
  Vector<float,_4> *local_1e8;
  float *local_1c8;
  int local_1bc;
  undefined1 local_1b8 [4];
  int compNdx_1;
  Interval local_1a0;
  Interval local_188;
  undefined1 local_170 [8];
  Interval texelInterval;
  undefined1 local_150 [4];
  int compNdx;
  undefined1 local_138 [8];
  Interval weightInterval;
  undefined1 auStack_118 [4];
  int i_1;
  double local_110;
  double local_108;
  int local_fc;
  undefined1 local_f8 [4];
  int ndx;
  Interval resultIntervals [4];
  IVec3 local_88;
  int local_7c;
  undefined1 local_78 [4];
  int i;
  Vec4 texelsMax [2];
  Vec4 texelsMin [2];
  Vec4 *resultMax_local;
  Vec4 *resultMin_local;
  int level_local;
  int layer_local;
  float weight_local;
  IVec3 *texelBase_local;
  SampleVerifier *this_local;
  
  local_1c8 = texelsMax[1].m_data + 2;
  texelsMin[1].m_data._8_8_ = resultMax;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_1c8);
    local_1c8 = local_1c8 + 4;
  } while (local_1c8 != texelsMin[1].m_data + 2);
  local_1e8 = (Vector<float,_4> *)local_78;
  do {
    tcu::Vector<float,_4>::Vector(local_1e8);
    local_1e8 = local_1e8 + 1;
  } while (local_1e8 != (Vector<float,_4> *)(texelsMax[1].m_data + 2));
  for (local_7c = 0; local_7c < 2; local_7c = local_7c + 1) {
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)&resultIntervals[3].m_hi + 4),local_7c,0,0)
    ;
    tcu::operator+((tcu *)&local_88,texelBase,(Vector<int,_3> *)((long)&resultIntervals[3].m_hi + 4)
                  );
    fetchTexel(this,&local_88,layer,level,VK_FILTER_LINEAR,
               (Vec4 *)(texelsMax[(long)local_7c + 1].m_data + 2),
               (Vec4 *)(local_78 + (long)local_7c * 0x10));
  }
  local_208 = (Interval *)local_f8;
  do {
    tcu::Interval::Interval(local_208);
    local_208 = local_208 + 1;
  } while (local_208 != (Interval *)&resultIntervals[3].m_hi);
  for (local_fc = 0; local_fc < 4; local_fc = local_fc + 1) {
    tcu::Interval::Interval((Interval *)auStack_118,0.0);
    lVar3 = (long)local_fc;
    *(undefined8 *)(local_f8 + lVar3 * 0x18) = _auStack_118;
    *(double *)(resultIntervals + lVar3) = local_110;
    resultIntervals[lVar3].m_lo = local_108;
  }
  for (weightInterval.m_hi._4_4_ = 0; weightInterval.m_hi._4_4_ < 2;
      weightInterval.m_hi._4_4_ = weightInterval.m_hi._4_4_ + 1) {
    local_224 = weight;
    if (weightInterval.m_hi._4_4_ == 0) {
      local_224 = 1.0 - weight;
    }
    tcu::Interval::Interval((Interval *)local_150,(double)local_224);
    tcu::FloatFormat::roundOut
              ((Interval *)local_138,&this->m_filteringPrecision,(Interval *)local_150,false);
    for (texelInterval.m_hi._4_4_ = 0; texelInterval.m_hi._4_4_ < 4;
        texelInterval.m_hi._4_4_ = texelInterval.m_hi._4_4_ + 1) {
      pfVar2 = tcu::Vector<float,_4>::operator[]
                         ((Vector<float,_4> *)
                          (texelsMax[(long)weightInterval.m_hi._4_4_ + 1].m_data + 2),
                          texelInterval.m_hi._4_4_);
      fVar1 = *pfVar2;
      pfVar2 = tcu::Vector<float,_4>::operator[]
                         ((Vector<float,_4> *)(local_78 + (long)weightInterval.m_hi._4_4_ * 0x10),
                          texelInterval.m_hi._4_4_);
      tcu::Interval::Interval((Interval *)local_170,false,(double)fVar1,(double)*pfVar2);
      lVar3 = (long)texelInterval.m_hi._4_4_;
      tcu::operator*((Interval *)local_1b8,(Interval *)local_138,(Interval *)local_170);
      tcu::operator+(&local_1a0,(Interval *)(local_f8 + lVar3 * 0x18),(Interval *)local_1b8);
      tcu::FloatFormat::roundOut(&local_188,&this->m_filteringPrecision,&local_1a0,false);
      lVar3 = (long)texelInterval.m_hi._4_4_;
      *(undefined8 *)(local_f8 + lVar3 * 0x18) = local_188._0_8_;
      *(double *)(resultIntervals + lVar3) = local_188.m_lo;
      resultIntervals[lVar3].m_lo = local_188.m_hi;
    }
  }
  for (local_1bc = 0; local_1bc < 4; local_1bc = local_1bc + 1) {
    dVar4 = tcu::Interval::lo((Interval *)(local_f8 + (long)local_1bc * 0x18));
    pfVar2 = tcu::Vector<float,_4>::operator[](resultMin,local_1bc);
    *pfVar2 = (float)dVar4;
    dVar4 = tcu::Interval::hi((Interval *)(local_f8 + (long)local_1bc * 0x18));
    pfVar2 = tcu::Vector<float,_4>::operator[]
                       ((Vector<float,_4> *)texelsMin[1].m_data._8_8_,local_1bc);
    *pfVar2 = (float)dVar4;
  }
  return;
}

Assistant:

void SampleVerifier::getFilteredSample1D (const IVec3&	texelBase,
										  float			weight,
										  int			layer,
										  int			level,
										  Vec4&			resultMin,
										  Vec4&			resultMax) const
{
	Vec4 texelsMin[2];
	Vec4 texelsMax[2];

	for (int i = 0; i < 2; ++i)
	{
	    fetchTexel(texelBase + IVec3(i, 0, 0), layer, level, VK_FILTER_LINEAR, texelsMin[i], texelsMax[i]);
	}

	Interval resultIntervals[4];

	for (int ndx = 0; ndx < 4; ++ndx)
	{
		resultIntervals[ndx] = Interval(0.0);
	}

    for (int i = 0; i < 2; ++i)
	{
		const Interval weightInterval = m_filteringPrecision.roundOut(Interval(i == 0 ? 1.0f - weight : weight), false);

		for (int compNdx = 0; compNdx < 4; ++compNdx)
		{
			const Interval texelInterval(false, texelsMin[i][compNdx], texelsMax[i][compNdx]);

			resultIntervals[compNdx] = m_filteringPrecision.roundOut(resultIntervals[compNdx] + weightInterval * texelInterval, false);
		}
	}

	for (int compNdx = 0; compNdx < 4; ++compNdx)
	{
		resultMin[compNdx] = (float)resultIntervals[compNdx].lo();
		resultMax[compNdx] = (float)resultIntervals[compNdx].hi();
	}
}